

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Metadata * kj::anon_unknown_9::statToMetadata(Metadata *__return_storage_ptr__,stat *stats)

{
  ulong uVar1;
  ulong uVar2;
  Type TVar3;
  
  uVar1 = stats->st_dev;
  uVar2 = stats->st_ino;
  TVar3 = modeToType(stats->st_mode);
  __return_storage_ptr__->type = TVar3;
  __return_storage_ptr__->size = stats->st_size;
  __return_storage_ptr__->spaceUsed = stats->st_blocks << 9;
  (__return_storage_ptr__->lastModified).value.value =
       (stats->st_mtim).tv_sec * 1000000000 + (stats->st_mtim).tv_nsec;
  __return_storage_ptr__->linkCount = (uint)stats->st_nlink;
  __return_storage_ptr__->hashCode = (uVar1 << 0x20 | uVar1 >> 0x20) ^ uVar2;
  return __return_storage_ptr__;
}

Assistant:

static FsNode::Metadata statToMetadata(struct stat& stats) {
  // Probably st_ino and st_dev are usually under 32 bits, so mix by rotating st_dev left 32 bits
  // and XOR.
  uint64_t d = stats.st_dev;
  uint64_t hash = ((d << 32) | (d >> 32)) ^ stats.st_ino;

  return FsNode::Metadata {
    modeToType(stats.st_mode),
    implicitCast<uint64_t>(stats.st_size),
    implicitCast<uint64_t>(stats.st_blocks * 512u),
#if __APPLE__
    toKjDate(stats.st_mtimespec),
#else
    toKjDate(stats.st_mtim),
#endif
    implicitCast<uint>(stats.st_nlink),
    hash
  };
}